

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrgload.c
# Opt level: O0

FT_Error pfr_glyph_load_compound(PFR_Glyph glyph,FT_Byte *p,FT_Byte *limit)

{
  byte bVar1;
  uint uVar2;
  FT_Memory memory_00;
  FT_Byte *pFVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  FT_Pointer pvVar7;
  FT_UInt format;
  FT_UInt new_max;
  FT_Int y_pos;
  FT_Int x_pos;
  FT_UInt org_count;
  FT_UInt count;
  FT_UInt i;
  FT_UInt flags;
  PFR_SubGlyph subglyph;
  FT_Memory memory;
  FT_GlyphLoader loader;
  FT_Byte *pFStack_20;
  FT_Error error;
  FT_Byte *limit_local;
  FT_Byte *p_local;
  PFR_Glyph glyph_local;
  
  loader._4_4_ = 0;
  memory_00 = glyph->loader->memory;
  if (p + 1 <= limit) {
    limit_local = p + 1;
    bVar1 = *p;
    if ((bVar1 & 0x80) != 0) {
      uVar5 = bVar1 & 0x3f;
      pFStack_20 = limit;
      p_local = &glyph->format;
      if (((bVar1 & 0x40) != 0) &&
         (loader._4_4_ = pfr_extra_items_skip(&limit_local,limit), loader._4_4_ != 0)) {
        return loader._4_4_;
      }
      uVar2 = *(uint *)(p_local + 0x18);
      if (*(uint *)(p_local + 0x1c) < uVar2 + uVar5) {
        uVar6 = uVar2 + uVar5 + 3 & 0xfffffffc;
        if (0x40 < uVar6) {
          return 8;
        }
        pvVar7 = ft_mem_realloc(memory_00,0x20,(ulong)*(uint *)(p_local + 0x1c),(ulong)uVar6,
                                *(void **)(p_local + 0x20),(FT_Error *)((long)&loader + 4));
        *(FT_Pointer *)(p_local + 0x20) = pvVar7;
        if (loader._4_4_ != 0) {
          return loader._4_4_;
        }
        *(uint *)(p_local + 0x1c) = uVar6;
      }
      _i = (long *)(*(long *)(p_local + 0x20) + (ulong)uVar2 * 0x20);
      org_count = 0;
      while( true ) {
        if (uVar5 <= org_count) {
          return loader._4_4_;
        }
        new_max = 0;
        format = 0;
        if (pFStack_20 < limit_local + 1) break;
        bVar1 = *limit_local;
        *_i = 0x10000;
        pFVar3 = limit_local + 1;
        if ((bVar1 & 0x10) != 0) {
          if (pFStack_20 < limit_local + 3) {
            return 8;
          }
          *_i = (long)((int)CONCAT11(limit_local[1],limit_local[2]) << 4);
          pFVar3 = limit_local + 3;
        }
        limit_local = pFVar3;
        _i[1] = 0x10000;
        if ((bVar1 & 0x20) != 0) {
          if (pFStack_20 < limit_local + 2) {
            return 8;
          }
          _i[1] = (long)((int)CONCAT11(*limit_local,limit_local[1]) << 4);
          limit_local = limit_local + 2;
        }
        if ((bVar1 & 3) == 1) {
          if (pFStack_20 < limit_local + 2) {
            return 8;
          }
          new_max = (FT_UInt)CONCAT11(*limit_local,limit_local[1]);
          limit_local = limit_local + 2;
        }
        else if ((bVar1 & 3) == 2) {
          if (pFStack_20 < limit_local + 1) {
            return 8;
          }
          new_max = (FT_UInt)(char)*limit_local;
          limit_local = limit_local + 1;
        }
        bVar4 = bVar1 >> 2 & 3;
        if (bVar4 == 1) {
          if (pFStack_20 < limit_local + 2) {
            return 8;
          }
          format = (FT_UInt)CONCAT11(*limit_local,limit_local[1]);
          limit_local = limit_local + 2;
        }
        else if (bVar4 == 2) {
          if (pFStack_20 < limit_local + 1) {
            return 8;
          }
          format = (FT_UInt)(char)*limit_local;
          limit_local = limit_local + 1;
        }
        *(FT_UInt *)(_i + 2) = new_max;
        *(FT_UInt *)((long)_i + 0x14) = format;
        if ((bVar1 & 0x40) == 0) {
          if (pFStack_20 < limit_local + 1) {
            return 8;
          }
          *(uint *)((long)_i + 0x1c) = (uint)*limit_local;
          limit_local = limit_local + 1;
        }
        else {
          if (pFStack_20 < limit_local + 2) {
            return 8;
          }
          *(uint *)((long)_i + 0x1c) = (uint)CONCAT11(*limit_local,limit_local[1]);
          limit_local = limit_local + 2;
        }
        if ((bVar1 & 0x80) == 0) {
          if (pFStack_20 < limit_local + 2) {
            return 8;
          }
          *(uint *)(_i + 3) = (uint)CONCAT11(*limit_local,limit_local[1]);
          limit_local = limit_local + 2;
        }
        else {
          if (pFStack_20 < limit_local + 3) {
            return 8;
          }
          *(uint *)(_i + 3) =
               (uint)*limit_local << 0x10 | (uint)limit_local[1] << 8 | (uint)limit_local[2];
          limit_local = limit_local + 3;
        }
        *(int *)(p_local + 0x18) = *(int *)(p_local + 0x18) + 1;
        org_count = org_count + 1;
        _i = _i + 4;
      }
      return 8;
    }
  }
  return 8;
}

Assistant:

static FT_Error
  pfr_glyph_load_compound( PFR_Glyph  glyph,
                           FT_Byte*   p,
                           FT_Byte*   limit )
  {
    FT_Error        error  = FT_Err_Ok;
    FT_GlyphLoader  loader = glyph->loader;
    FT_Memory       memory = loader->memory;
    PFR_SubGlyph    subglyph;
    FT_UInt         flags, i, count, org_count;
    FT_Int          x_pos, y_pos;


    PFR_CHECK( 1 );
    flags = PFR_NEXT_BYTE( p );

    /* test for composite glyphs */
    if ( !( flags & PFR_GLYPH_IS_COMPOUND ) )
      goto Failure;

    count = flags & 0x3F;

    /* ignore extra items when present */
    /*                                 */
    if ( flags & PFR_GLYPH_COMPOUND_EXTRA_ITEMS )
    {
      error = pfr_extra_items_skip( &p, limit );
      if ( error )
        goto Exit;
    }

    /* we can't rely on the FT_GlyphLoader to load sub-glyphs, because   */
    /* the PFR format is dumb, using direct file offsets to point to the */
    /* sub-glyphs (instead of glyph indices).  Sigh.                     */
    /*                                                                   */
    /* For now, we load the list of sub-glyphs into a different array    */
    /* but this will prevent us from using the auto-hinter at its best   */
    /* quality.                                                          */
    /*                                                                   */
    org_count = glyph->num_subs;

    if ( org_count + count > glyph->max_subs )
    {
      FT_UInt  new_max = ( org_count + count + 3 ) & (FT_UInt)-4;


      /* we arbitrarily limit the number of subglyphs */
      /* to avoid endless recursion                   */
      if ( new_max > 64 )
      {
        error = FT_THROW( Invalid_Table );
        FT_ERROR(( "pfr_glyph_load_compound:"
                   " too many compound glyphs components\n" ));
        goto Exit;
      }

      if ( FT_RENEW_ARRAY( glyph->subs, glyph->max_subs, new_max ) )
        goto Exit;

      glyph->max_subs = new_max;
    }

    subglyph = glyph->subs + org_count;

    for ( i = 0; i < count; i++, subglyph++ )
    {
      FT_UInt  format;


      x_pos = 0;
      y_pos = 0;

      PFR_CHECK( 1 );
      format = PFR_NEXT_BYTE( p );

      /* read scale when available */
      subglyph->x_scale = 0x10000L;
      if ( format & PFR_SUBGLYPH_XSCALE )
      {
        PFR_CHECK( 2 );
        subglyph->x_scale = PFR_NEXT_SHORT( p ) * 16;
      }

      subglyph->y_scale = 0x10000L;
      if ( format & PFR_SUBGLYPH_YSCALE )
      {
        PFR_CHECK( 2 );
        subglyph->y_scale = PFR_NEXT_SHORT( p ) * 16;
      }

      /* read offset */
      switch ( format & 3 )
      {
      case 1:
        PFR_CHECK( 2 );
        x_pos = PFR_NEXT_SHORT( p );
        break;

      case 2:
        PFR_CHECK( 1 );
        x_pos += PFR_NEXT_INT8( p );
        break;

      default:
        ;
      }

      switch ( ( format >> 2 ) & 3 )
      {
      case 1:
        PFR_CHECK( 2 );
        y_pos = PFR_NEXT_SHORT( p );
        break;

      case 2:
        PFR_CHECK( 1 );
        y_pos += PFR_NEXT_INT8( p );
        break;

      default:
        ;
      }

      subglyph->x_delta = x_pos;
      subglyph->y_delta = y_pos;

      /* read glyph position and size now */
      if ( format & PFR_SUBGLYPH_2BYTE_SIZE )
      {
        PFR_CHECK( 2 );
        subglyph->gps_size = PFR_NEXT_USHORT( p );
      }
      else
      {
        PFR_CHECK( 1 );
        subglyph->gps_size = PFR_NEXT_BYTE( p );
      }

      if ( format & PFR_SUBGLYPH_3BYTE_OFFSET )
      {
        PFR_CHECK( 3 );
        subglyph->gps_offset = PFR_NEXT_ULONG( p );
      }
      else
      {
        PFR_CHECK( 2 );
        subglyph->gps_offset = PFR_NEXT_USHORT( p );
      }

      glyph->num_subs++;
    }

  Exit:
    return error;

  Failure:
  Too_Short:
    error = FT_THROW( Invalid_Table );
    FT_ERROR(( "pfr_glyph_load_compound: invalid glyph data\n" ));
    goto Exit;
  }